

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_ori_i32_mips64(TCGContext_conflict5 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,int32_t arg2)

{
  TCGv_i32 arg2_00;
  uintptr_t o;
  
  if (arg2 == 0) {
    tcg_gen_mov_i32(tcg_ctx,ret,arg1);
    return;
  }
  if (arg2 == -1) {
    tcg_gen_movi_i32(tcg_ctx,ret,-1);
    return;
  }
  arg2_00 = tcg_const_i32_mips64(tcg_ctx,arg2);
  tcg_gen_or_i32(tcg_ctx,ret,arg1,arg2_00);
  tcg_temp_free_internal_mips64(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_ori_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, int32_t arg2)
{
    /* Some cases can be optimized here.  */
    if (arg2 == -1) {
        tcg_gen_movi_i32(tcg_ctx, ret, -1);
    } else if (arg2 == 0) {
        tcg_gen_mov_i32(tcg_ctx, ret, arg1);
    } else {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_or_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}